

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void av1_highbd_inv_txfm_add_avx2(tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  byte bVar1;
  byte tx_type;
  uint bd;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  transform_1d_avx2_conflict p_Var5;
  transform_1d_avx2_conflict p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  tran_low_t *ptVar16;
  undefined1 (*pauVar17) [32];
  ulong uVar18;
  undefined1 (*pauVar19) [32];
  int iVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [32];
  long lVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  bool bVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  __m256i buf1 [512];
  int local_492c;
  byte local_48fc;
  longlong local_4860 [4];
  undefined1 auStack_4840 [32];
  undefined1 auStack_4820 [32];
  undefined1 auStack_4800 [32];
  undefined1 auStack_47e0 [32];
  undefined1 auStack_47c0 [32];
  undefined1 auStack_47a0 [32];
  undefined1 auStack_4780 [1824];
  longlong local_4060 [28];
  undefined1 local_3f80 [16208];
  
  bVar1 = txfm_param->tx_size;
  uVar25 = (ulong)bVar1;
  if ((bVar1 < 0xf) && ((0x6061U >> (bVar1 & 0x1f) & 1) != 0)) {
    av1_highbd_inv_txfm_add_sse4_1(input,dest,stride,txfm_param);
    return;
  }
  tx_type = txfm_param->tx_type;
  bd = txfm_param->bd;
  iVar23 = txfm_param->eob;
  if (8 < tx_type) {
    if (6 < tx_type - 9) {
      return;
    }
    av1_highbd_inv_txfm2d_add_universe_sse4_1(input,dest,stride,tx_type,bVar1,iVar23,bd);
    return;
  }
  local_492c = 0;
  uVar34 = 0;
  iVar20 = 0;
  if (iVar23 != 1) {
    uVar34 = (int)av1_eob_to_eobxy_default[uVar25]
                  [iVar23 + -1 >> (*(byte *)(tx_size_wide_log2_eob + uVar25) & 0x1f)] & 0xff;
    iVar20 = (int)av1_eob_to_eobxy_default[uVar25]
                  [iVar23 + -1 >> (*(byte *)(tx_size_wide_log2_eob + uVar25) & 0x1f)] >> 8;
  }
  uVar18 = (ulong)((uint)bVar1 * 4);
  uVar2 = *(uint *)((long)tx_size_wide + uVar18);
  uVar3 = *(uint *)((long)tx_size_high + uVar18);
  uVar33 = (ulong)uVar3;
  lVar28 = (long)(int)uVar3;
  uVar29 = (int)uVar2 >> 3;
  uVar31 = iVar20 + 8 >> 3;
  uVar30 = 0x20;
  if ((int)uVar3 < 0x20) {
    uVar30 = uVar3;
  }
  if (uVar2 != uVar3) {
    if ((int)uVar3 < (int)uVar2) {
      local_492c = 1;
      if ((uVar3 * 2 == uVar2) || (local_492c = 2, uVar3 * 4 == uVar2)) goto LAB_00446676;
    }
    else {
      local_492c = -1;
      if ((uVar2 * 2 == uVar3) || (local_492c = -2, uVar2 * 4 == uVar3)) goto LAB_00446676;
    }
    local_492c = 0;
  }
LAB_00446676:
  pcVar4 = av1_inv_txfm_shift_ls[uVar25];
  bVar36 = 8 < tx_type;
  uVar22 = 0xaf >> (tx_type & 0x1f);
  p_Var5 = highbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_high_log2 + uVar18) + -2]
           [""[tx_type]][lowbd_txfm_all_1d_zeros_idx[iVar20]];
  if (0 < (int)uVar31) {
    p_Var6 = highbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_wide_log2 + uVar18) + -2]
             [""[tx_type]][lowbd_txfm_all_1d_zeros_idx[uVar34]];
    lVar35 = (ulong)((uVar34 & 0xf8) << 5) + 0x100;
    lVar32 = (ulong)uVar29 << 8;
    pauVar19 = (undefined1 (*) [32])(local_3f80 + ((long)(int)uVar29 + -1) * lVar28 * 0x20);
    pauVar27 = (undefined1 (*) [32])local_3f80;
    uVar18 = 0;
    auVar39._8_4_ = 0xb50;
    auVar39._0_8_ = 0xb5000000b50;
    auVar39._12_4_ = 0xb50;
    auVar39._16_4_ = 0xb50;
    auVar39._20_4_ = 0xb50;
    auVar39._24_4_ = 0xb50;
    auVar39._28_4_ = 0xb50;
    auVar41._8_4_ = 0x800;
    auVar41._0_8_ = 0x80000000800;
    auVar41._12_4_ = 0x800;
    auVar41._16_4_ = 0x800;
    auVar41._20_4_ = 0x800;
    auVar41._24_4_ = 0x800;
    auVar41._28_4_ = 0x800;
    do {
      lVar21 = 0;
      ptVar16 = input;
      do {
        uVar13 = *(undefined8 *)(ptVar16 + 2);
        uVar14 = *(undefined8 *)(ptVar16 + 4);
        uVar15 = *(undefined8 *)(ptVar16 + 6);
        *(undefined8 *)((long)local_4860 + lVar21) = *(undefined8 *)ptVar16;
        *(undefined8 *)((long)local_4860 + lVar21 + 8) = uVar13;
        *(undefined8 *)((long)local_4860 + lVar21 + 0x10) = uVar14;
        *(undefined8 *)(auStack_4840 + lVar21 + -8) = uVar15;
        lVar21 = lVar21 + 0x20;
        ptVar16 = ptVar16 + (int)uVar30;
      } while (lVar35 != lVar21);
      if ((local_492c == 1) || (local_492c == -1)) {
        lVar21 = 0;
        do {
          auVar37 = vpmulld_avx2(auVar39,*(undefined1 (*) [32])((long)local_4860 + lVar21));
          auVar37 = vpaddd_avx2(auVar37,auVar41);
          auVar37 = vpsrad_avx2(auVar37,0xc);
          *(undefined1 (*) [32])((long)local_4860 + lVar21) = auVar37;
          lVar21 = lVar21 + 0x20;
        } while (lVar35 != lVar21);
      }
      (*p_Var6)(&local_4860,&local_4860,0xc,0,bd,-(int)*pcVar4);
      if ((0x11fU >> (tx_type & 0x1f) & 1) == 0 && !bVar36) {
        if (0 < (int)uVar29) {
          lVar21 = 0;
          pauVar17 = pauVar19;
          do {
            auVar40 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_4780 + lVar21),
                                      *(undefined1 (*) [32])(auStack_47a0 + lVar21));
            auVar37 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_4780 + lVar21),
                                      *(undefined1 (*) [32])(auStack_47a0 + lVar21));
            auVar9 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_47c0 + lVar21),
                                     *(undefined1 (*) [32])(auStack_47e0 + lVar21));
            auVar38 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_47c0 + lVar21),
                                      *(undefined1 (*) [32])(auStack_47e0 + lVar21));
            auVar44 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_4800 + lVar21),
                                      *(undefined1 (*) [32])(auStack_4820 + lVar21));
            auVar43 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_4800 + lVar21),
                                      *(undefined1 (*) [32])(auStack_4820 + lVar21));
            auVar45 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_4840 + lVar21),
                                      *(undefined1 (*) [32])((long)local_4860 + lVar21));
            auVar42 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_4840 + lVar21),
                                      *(undefined1 (*) [32])((long)local_4860 + lVar21));
            auVar46 = vpunpcklqdq_avx2(auVar40,auVar9);
            auVar47 = vpunpcklqdq_avx2(auVar44,auVar45);
            auVar12 = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar47._0_16_;
            auVar11._16_8_ = auVar12._0_8_;
            auVar11._0_16_ = ZEXT116(0) * auVar47._0_16_ + ZEXT116(1) * auVar46._0_16_;
            auVar11._24_8_ = auVar12._8_8_;
            pauVar17[-7] = auVar11;
            auVar46 = vperm2i128_avx2(auVar46,auVar47,0x31);
            pauVar17[-3] = auVar46;
            auVar40 = vpunpckhqdq_avx2(auVar40,auVar9);
            auVar9 = vpunpckhqdq_avx2(auVar44,auVar45);
            auVar44._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar40._0_16_;
            auVar44._16_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar9._0_16_;
            pauVar17[-6] = auVar44;
            auVar40 = vperm2i128_avx2(auVar40,auVar9,0x31);
            pauVar17[-2] = auVar40;
            auVar40 = vpunpcklqdq_avx2(auVar37,auVar38);
            auVar9 = vpunpcklqdq_avx2(auVar43,auVar42);
            auVar45._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar40._0_16_;
            auVar45._16_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar9._0_16_;
            pauVar17[-5] = auVar45;
            auVar40 = vperm2i128_avx2(auVar40,auVar9,0x31);
            pauVar17[-1] = auVar40;
            auVar37 = vpunpckhqdq_avx2(auVar37,auVar38);
            auVar38 = vpunpckhqdq_avx2(auVar43,auVar42);
            auVar43._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
            auVar43._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
            pauVar17[-4] = auVar43;
            auVar37 = vperm2i128_avx2(auVar37,auVar38,0x31);
            *pauVar17 = auVar37;
            lVar21 = lVar21 + 0x100;
            pauVar17 = pauVar17 + -lVar28;
          } while (lVar32 != lVar21);
        }
      }
      else if (0 < (int)uVar29) {
        lVar21 = 0;
        pauVar17 = pauVar27;
        do {
          auVar40 = vpunpckldq_avx2(*(undefined1 (*) [32])((long)local_4860 + lVar21),
                                    *(undefined1 (*) [32])(auStack_4840 + lVar21));
          auVar37 = vpunpckhdq_avx2(*(undefined1 (*) [32])((long)local_4860 + lVar21),
                                    *(undefined1 (*) [32])(auStack_4840 + lVar21));
          auVar9 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_4820 + lVar21),
                                   *(undefined1 (*) [32])(auStack_4800 + lVar21));
          auVar38 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_4820 + lVar21),
                                    *(undefined1 (*) [32])(auStack_4800 + lVar21));
          auVar44 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_47e0 + lVar21),
                                    *(undefined1 (*) [32])(auStack_47c0 + lVar21));
          auVar43 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_47e0 + lVar21),
                                    *(undefined1 (*) [32])(auStack_47c0 + lVar21));
          auVar45 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_47a0 + lVar21),
                                    *(undefined1 (*) [32])(auStack_4780 + lVar21));
          auVar42 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_47a0 + lVar21),
                                    *(undefined1 (*) [32])(auStack_4780 + lVar21));
          auVar46 = vpunpcklqdq_avx2(auVar40,auVar9);
          auVar47 = vpunpcklqdq_avx2(auVar44,auVar45);
          auVar12 = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar47._0_16_;
          auVar10._16_8_ = auVar12._0_8_;
          auVar10._0_16_ = ZEXT116(0) * auVar47._0_16_ + ZEXT116(1) * auVar46._0_16_;
          auVar10._24_8_ = auVar12._8_8_;
          pauVar17[-7] = auVar10;
          auVar46 = vperm2i128_avx2(auVar46,auVar47,0x31);
          pauVar17[-3] = auVar46;
          auVar40 = vpunpckhqdq_avx2(auVar40,auVar9);
          auVar9 = vpunpckhqdq_avx2(auVar44,auVar45);
          auVar46._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar40._0_16_;
          auVar46._16_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar9._0_16_;
          pauVar17[-6] = auVar46;
          auVar40 = vperm2i128_avx2(auVar40,auVar9,0x31);
          pauVar17[-2] = auVar40;
          auVar40 = vpunpcklqdq_avx2(auVar37,auVar38);
          auVar9 = vpunpcklqdq_avx2(auVar43,auVar42);
          auVar47._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar40._0_16_;
          auVar47._16_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar9._0_16_;
          pauVar17[-5] = auVar47;
          auVar40 = vperm2i128_avx2(auVar40,auVar9,0x31);
          pauVar17[-1] = auVar40;
          auVar37 = vpunpckhqdq_avx2(auVar37,auVar38);
          auVar38 = vpunpckhqdq_avx2(auVar43,auVar42);
          auVar42._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
          auVar42._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
          pauVar17[-4] = auVar42;
          auVar37 = vperm2i128_avx2(auVar37,auVar38,0x31);
          *pauVar17 = auVar37;
          lVar21 = lVar21 + 0x100;
          pauVar17 = pauVar17 + lVar28;
        } while (lVar32 != lVar21);
      }
      uVar18 = uVar18 + 1;
      input = input + 8;
      pauVar19 = pauVar19 + 8;
      pauVar27 = pauVar27 + 8;
    } while (uVar18 != uVar31);
  }
  if (0 < (int)uVar29) {
    pauVar27 = (undefined1 (*) [32])local_4060;
    uVar18 = 0;
    do {
      (*p_Var5)((__m256i *)(local_4060 + uVar18 * lVar28 * 4),
                (__m256i *)(local_4060 + uVar18 * lVar28 * 4),0xc,1,bd,0);
      bVar1 = pcVar4[1];
      pauVar19 = pauVar27;
      uVar24 = uVar33;
      if ((char)bVar1 < '\0') {
        iVar23 = 1 << (~bVar1 & 0x1f);
        auVar37._4_4_ = iVar23;
        auVar37._0_4_ = iVar23;
        auVar37._8_4_ = iVar23;
        auVar37._12_4_ = iVar23;
        auVar37._16_4_ = iVar23;
        auVar37._20_4_ = iVar23;
        auVar37._24_4_ = iVar23;
        auVar37._28_4_ = iVar23;
        do {
          auVar39 = vpaddd_avx2(auVar37,*pauVar19);
          auVar39 = vpsrad_avx2(auVar39,ZEXT416((uint)-(int)(char)bVar1));
          *pauVar19 = auVar39;
          pauVar19 = pauVar19 + 1;
          uVar24 = uVar24 - 1;
        } while (uVar24 != 0);
      }
      else {
        do {
          auVar39 = vpslld_avx2(*pauVar19,ZEXT416((uint)(int)(char)bVar1));
          *pauVar19 = auVar39;
          pauVar19 = pauVar19 + 1;
          uVar24 = uVar24 - 1;
        } while (uVar24 != 0);
      }
      uVar18 = uVar18 + 1;
      pauVar27 = pauVar27 + lVar28;
    } while (uVar18 != uVar29);
  }
  pauVar27 = (undefined1 (*) [32])((long)dest * 2);
  local_48fc = (byte)uVar22;
  if ((0x75f1cUL >> (uVar25 & 0x3f) & 1) == 0) {
    if ((0x80c2UL >> (uVar25 & 0x3f) & 1) != 0) {
      auVar40._8_2_ = 1;
      auVar40._0_8_ = 0x1000100010001;
      auVar40._10_2_ = 1;
      auVar40._12_2_ = 1;
      auVar40._14_2_ = 1;
      auVar40._16_2_ = 1;
      auVar40._18_2_ = 1;
      auVar40._20_2_ = 1;
      auVar40._22_2_ = 1;
      auVar40._24_2_ = 1;
      auVar40._26_2_ = 1;
      auVar40._28_2_ = 1;
      auVar40._30_2_ = 1;
      auVar41 = vpsllw_avx2(auVar40,ZEXT416(bd));
      auVar39 = vpcmpeqd_avx2(auVar40,auVar40);
      auVar39 = vpaddw_avx2(auVar41,auVar39);
      uVar25 = 0;
      if (!bVar36 && (uVar22 & 1) == 0) {
        uVar25 = (ulong)(uVar3 - 1);
      }
      pauVar19 = (undefined1 (*) [32])(local_4060 + uVar25 * 4);
      do {
        auVar41 = vpmovsxwd_avx2(*(undefined1 (*) [16])*pauVar27);
        auVar41 = vpaddd_avx2(auVar41,*pauVar19);
        auVar12 = vpackusdw_avx(auVar41._0_16_,auVar41._16_16_);
        auVar8 = vpcmpgtw_avx(auVar12,auVar39._0_16_);
        auVar7 = vpandn_avx(auVar8,auVar12);
        auVar12 = vpand_avx(auVar8,auVar39._0_16_);
        auVar7 = vpor_avx(auVar7,auVar12);
        auVar12 = vpcmpgtw_avx(auVar7,(undefined1  [16])0x0);
        auVar12 = vpand_avx(auVar7,auVar12);
        *(undefined1 (*) [16])*pauVar27 = auVar12;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + (long)stride * 2);
        pauVar19 = (undefined1 (*) [32])(pauVar19[-1] + (((bVar36 | local_48fc) & 1) << 6));
        uVar33 = uVar33 - 1;
      } while (uVar33 != 0);
    }
  }
  else if ((0xa0e3UL >> (uVar25 & 0x3f) & 1) == 0) {
    auVar38._8_2_ = 1;
    auVar38._0_8_ = 0x1000100010001;
    auVar38._10_2_ = 1;
    auVar38._12_2_ = 1;
    auVar38._14_2_ = 1;
    auVar38._16_2_ = 1;
    auVar38._18_2_ = 1;
    auVar38._20_2_ = 1;
    auVar38._22_2_ = 1;
    auVar38._24_2_ = 1;
    auVar38._26_2_ = 1;
    auVar38._28_2_ = 1;
    auVar38._30_2_ = 1;
    auVar41 = vpsllw_avx2(auVar38,ZEXT416(bd));
    auVar39 = vpcmpeqd_avx2(ZEXT432(bd),ZEXT432(bd));
    uVar18 = 0;
    uVar25 = (ulong)(uVar3 - 1);
    if (bVar36 || (uVar22 & 1) != 0) {
      uVar25 = uVar18;
    }
    auVar39 = vpaddw_avx2(auVar41,auVar39);
    uVar24 = 0;
    do {
      pauVar17 = (undefined1 (*) [32])(local_4060 + uVar25 * 4 + (long)(int)uVar18 * 4);
      uVar26 = uVar33;
      pauVar19 = pauVar27;
      do {
        auVar41 = vpmovsxwd_avx2(*(undefined1 (*) [16])*pauVar19);
        auVar37 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar19 + 0x10));
        auVar41 = vpaddd_avx2(auVar41,*pauVar17);
        auVar37 = vpaddd_avx2(auVar37,pauVar17[uVar33]);
        auVar41 = vpackusdw_avx2(auVar41,auVar37);
        auVar37 = vpermq_avx2(auVar41,0xd8);
        auVar41 = vpcmpgtw_avx2(auVar37,auVar39);
        auVar37 = vpandn_avx2(auVar41,auVar37);
        auVar41 = vpand_avx2(auVar41,auVar39);
        auVar37 = vpor_avx2(auVar37,auVar41);
        auVar41 = vpcmpgtw_avx2(auVar37,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar41 = vpand_avx2(auVar37,auVar41);
        *pauVar19 = auVar41;
        pauVar19 = (undefined1 (*) [32])(*pauVar19 + (long)stride * 2);
        pauVar17 = (undefined1 (*) [32])(pauVar17[-1] + (((bVar36 | local_48fc) & 1) << 6));
        uVar26 = uVar26 - 1;
      } while (uVar26 != 0);
      uVar24 = uVar24 + 1;
      pauVar27 = pauVar27 + 1;
      uVar18 = (ulong)((int)uVar18 + uVar3 * 2);
    } while (uVar24 != (uVar2 >> 4) + (uint)(uVar2 >> 4 == 0));
  }
  return;
}

Assistant:

void av1_highbd_inv_txfm_add_avx2(const tran_low_t *input, uint8_t *dest,
                                  int stride, const TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_4X8:
    case TX_8X4:
    case TX_4X4:
    case TX_16X4:
    case TX_4X16:
      av1_highbd_inv_txfm_add_sse4_1(input, dest, stride, txfm_param);
      break;
    default:
      av1_highbd_inv_txfm2d_add_universe_avx2(
          input, dest, stride, txfm_param->tx_type, txfm_param->tx_size,
          txfm_param->eob, txfm_param->bd);
      break;
  }
}